

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_int clGetSupportedD3D11TextureFormatsINTEL
                 (cl_context context,cl_mem_flags flags,cl_mem_object_type image_type,cl_uint plane,
                 cl_uint num_entries,DXGI_FORMAT *d3d11_formats,cl_uint *num_texture_formats)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  CLIntercept *this;
  undefined8 uVar3;
  undefined8 uVar4;
  uint errorCode;
  cl_platform_id p_Var5;
  mapped_type *pmVar6;
  time_point start;
  time_point end;
  undefined4 in_register_00000014;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _func_cl_int_cl_context_cl_mem_flags_cl_mem_object_type_cl_uint_cl_uint_DXGI_FORMAT_ptr_cl_uint_ptr
  *p_Var9;
  undefined1 local_98 [32];
  __int_type local_78;
  _func_cl_int_cl_context_cl_mem_flags_cl_mem_object_type_cl_uint_cl_uint_DXGI_FORMAT_ptr_cl_uint_ptr
  *local_70;
  ulong local_68;
  undefined8 local_60;
  DXGI_FORMAT *local_58;
  string local_50;
  
  this = g_pIntercept;
  local_60 = CONCAT44(in_register_00000014,image_type);
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x22;
  }
  local_58 = d3d11_formats;
  p_Var5 = CLIntercept::getPlatform(g_pIntercept,context);
  p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &p_Var1->_M_header;
  for (; p_Var8 != (_Base_ptr)0x0;
      p_Var8 = (&p_Var8->_M_left)[*(cl_platform_id *)(p_Var8 + 1) < p_Var5]) {
    if (*(cl_platform_id *)(p_Var8 + 1) >= p_Var5) {
      p_Var7 = p_Var8;
    }
  }
  p_Var8 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
     (p_Var8 = p_Var7, p_Var5 < *(cl_platform_id *)(p_Var7 + 1))) {
    p_Var8 = &p_Var1->_M_header;
  }
  local_68 = (ulong)plane;
  if ((_Rb_tree_header *)p_Var8 == p_Var1) {
    local_98._0_8_ = (key_type)0x0;
    pmVar6 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_98);
  }
  else {
    pmVar6 = (mapped_type *)&p_Var8[1]._M_parent;
  }
  p_Var9 = pmVar6->clGetSupportedD3D11TextureFormatsINTEL;
  if (p_Var9 == (_func_cl_int_cl_context_cl_mem_flags_cl_mem_object_type_cl_uint_cl_uint_DXGI_FORMAT_ptr_cl_uint_ptr
                 *)0x0) goto LAB_00139a84;
  local_78 = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  local_70 = p_Var9;
  if ((this->m_Config).CallLogging == true) {
    CEnumNameMap::name_mem_flags_abi_cxx11_((string *)local_98,&this->m_EnumNameMap,flags);
    uVar4 = local_60;
    uVar3 = local_98._0_8_;
    CEnumNameMap::name_abi_cxx11_(&local_50,&this->m_EnumNameMap,(cl_int)local_60);
    CLIntercept::callLoggingEnter
              (this,"clGetSupportedD3D11TextureFormatsINTEL",local_78,(cl_kernel)0x0,
               "context = %p, flags = %s (%llX), image_type = %s (%X), plane = %u",context,uVar3,
               flags,local_50._M_dataplus._M_p,uVar4,local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((key_type)local_98._0_8_ != (key_type)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_);
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    start.__d.__r = (duration)0;
  }
  else {
    start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pmVar6->clGetSupportedD3D11TextureFormatsINTEL)
                        (context,flags,(cl_mem_object_type)local_60,(cl_uint)local_68,num_entries,
                         local_58,num_texture_formats);
  pmVar6 = (mapped_type *)(ulong)errorCode;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
    p_Var9 = local_70;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    p_Var9 = local_70;
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_78 &&
        (local_78 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_98._0_8_ = (key_type)(local_98 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
      CLIntercept::updateHostTimingStats
                (this,"clGetSupportedD3D11TextureFormatsINTEL",(string *)local_98,start,end);
      if ((key_type)local_98._0_8_ != (key_type)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
    }
  }
  bVar2 = (this->m_Config).ErrorLogging;
  if ((bVar2 == false) && ((this->m_Config).ErrorAssert == false)) {
    if ((errorCode != 0) && ((this->m_Config).NoErrors != false)) {
LAB_001399d6:
      if (bVar2 != false) {
        CLIntercept::logError(this,"clGetSupportedD3D11TextureFormatsINTEL",errorCode);
      }
      if ((this->m_Config).ErrorAssert == true) {
        raise(5);
      }
      if ((this->m_Config).NoErrors != false) {
        pmVar6 = (mapped_type *)0x0;
      }
    }
  }
  else {
    if (errorCode != 0) goto LAB_001399d6;
    pmVar6 = (mapped_type *)0x0;
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clGetSupportedD3D11TextureFormatsINTEL",(cl_int)pmVar6,(cl_event *)0x0,
               (cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_98._0_8_ = (key_type)(local_98 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
    CLIntercept::chromeCallLoggingExit
              (this,"clGetSupportedD3D11TextureFormatsINTEL",(string *)local_98,false,0,start,end);
    if ((key_type)local_98._0_8_ != (key_type)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_);
    }
  }
LAB_00139a84:
  if (p_Var9 == (_func_cl_int_cl_context_cl_mem_flags_cl_mem_object_type_cl_uint_cl_uint_DXGI_FORMAT_ptr_cl_uint_ptr
                 *)0x0) {
    return -0x22;
  }
  return (cl_int)pmVar6;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clGetSupportedD3D11TextureFormatsINTEL(
    cl_context context,
    cl_mem_flags flags,
    cl_mem_object_type image_type,
    cl_uint plane,
    cl_uint num_entries,
    DXGI_FORMAT* d3d11_formats,
    cl_uint* num_texture_formats)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clGetSupportedD3D11TextureFormatsINTEL )
        {
            GET_ENQUEUE_COUNTER();
            CALL_LOGGING_ENTER( "context = %p, flags = %s (%llX), image_type = %s (%X), plane = %u",
                context,
                pIntercept->enumName().name_mem_flags( flags ).c_str(),
                flags,
                pIntercept->enumName().name( image_type ).c_str(),
                image_type,
                plane );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clGetSupportedD3D11TextureFormatsINTEL(
                context,
                flags,
                image_type,
                plane,
                num_entries,
                d3d11_formats,
                num_texture_formats);

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            CALL_LOGGING_EXIT( retVal );

            return retVal;
        }
    }
    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_CONTEXT);
}